

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

RegOpnd * __thiscall
Lowerer::GenerateFunctionTypeFromFixedFunctionObject
          (Lowerer *this,Instr *insertInstrPt,Opnd *functionObjOpnd)

{
  code *pcVar1;
  OpndKind OVar2;
  OpndKind OVar3;
  bool bVar4;
  RegOpnd *dst;
  undefined4 *puVar5;
  IndirOpnd *src;
  
  dst = IR::RegOpnd::New(TyInt64,this->m_func);
  OVar2 = IR::Opnd::GetKind(functionObjOpnd);
  OVar3 = IR::Opnd::GetKind(functionObjOpnd);
  if (OVar2 == OpndKindAddr) {
    if (OVar3 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar4) {
LAB_005ed19f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    src = (IndirOpnd *)
          IR::MemRefOpnd::New(functionObjOpnd[2]._vptr_Opnd + 1,TyUint64,this->m_func,
                              AddrOpndKindDynamicObjectTypeRef);
  }
  else {
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_005ed19f;
      *puVar5 = 0;
    }
    src = IR::IndirOpnd::New((RegOpnd *)functionObjOpnd,8,TyUint64,this->m_func,false);
  }
  InsertMove(&dst->super_Opnd,&src->super_Opnd,insertInstrPt,true);
  return dst;
}

Assistant:

IR::RegOpnd*
Lowerer::GenerateFunctionTypeFromFixedFunctionObject(IR::Instr *insertInstrPt, IR::Opnd* functionObjOpnd)
{
    IR::RegOpnd * functionTypeRegOpnd = IR::RegOpnd::New(TyMachReg, this->m_func);
    IR::Opnd *functionTypeOpnd = nullptr;

    if(functionObjOpnd->IsAddrOpnd())
    {
        IR::AddrOpnd* functionObjAddrOpnd = functionObjOpnd->AsAddrOpnd();
        // functionTypeRegOpnd = MOV [fixed function address + type offset]
        functionObjAddrOpnd->m_address;
        functionTypeOpnd = IR::MemRefOpnd::New((void *)((intptr_t)functionObjAddrOpnd->m_address + Js::RecyclableObject::GetOffsetOfType()), TyMachPtr, this->m_func,
            IR::AddrOpndKindDynamicObjectTypeRef);
    }
    else
    {
        functionTypeOpnd = IR::IndirOpnd::New(functionObjOpnd->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, this->m_func);
    }
    Lowerer::InsertMove(functionTypeRegOpnd, functionTypeOpnd, insertInstrPt);
    return functionTypeRegOpnd;
}